

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O3

void __thiscall
GraphTestNestedPhonyPrintsDone::~GraphTestNestedPhonyPrintsDone
          (GraphTestNestedPhonyPrintsDone *this)

{
  GraphTest::~GraphTest(&this->super_GraphTest);
  operator_delete(this,0x228);
  return;
}

Assistant:

TEST_F(GraphTest, NestedPhonyPrintsDone) {
  AssertParse(&state_,
"build n1: phony \n"
"build n2: phony n1\n"
  );
  string err;
  EXPECT_TRUE(scan_.RecomputeDirty(GetNode("n2"), &err));
  ASSERT_EQ("", err);

  Plan plan_;
  EXPECT_TRUE(plan_.AddTarget(GetNode("n2"), &err));
  ASSERT_EQ("", err);

  EXPECT_EQ(0, plan_.command_edge_count());
  ASSERT_FALSE(plan_.more_to_do());
}